

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ReceivedServerConnect(connectdata *conn,_Bool *received)

{
  int local_5c;
  int ftpcode;
  ssize_t nread;
  long timeout_ms;
  anon_union_264_9_0449b319_for_proto *paStack_40;
  int result;
  pingpong *pp;
  ftp_conn *ftpc;
  curl_socket_t data_sock;
  curl_socket_t ctrl_sock;
  SessionHandle *data;
  _Bool *received_local;
  connectdata *conn_local;
  
  _data_sock = conn->data;
  ftpc._4_4_ = conn->sock[0];
  ftpc._0_4_ = conn->sock[1];
  paStack_40 = &conn->proto;
  *received = false;
  pp = (pingpong *)paStack_40;
  data = (SessionHandle *)received;
  received_local = (_Bool *)conn;
  nread = ftp_timeleft_accept(_data_sock);
  Curl_infof(_data_sock,"Checking for server connect\n");
  if (nread < 0) {
    Curl_failf(_data_sock,"Accept timeout occurred while waiting server connect");
    conn_local._4_4_ = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else if ((((paStack_40->ftpc).pp.cache_size == 0) || ((paStack_40->ftpc).pp.cache == (char *)0x0))
          || (*(paStack_40->ftpc).pp.cache < '4')) {
    timeout_ms._4_4_ = Curl_socket_check(ftpc._4_4_,(curl_socket_t)ftpc,-1,0);
    if (timeout_ms._4_4_ == 0xffffffff) {
      Curl_failf(_data_sock,"Error while waiting for server connect");
      conn_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
    }
    else {
      if (timeout_ms._4_4_ != 0) {
        if ((timeout_ms._4_4_ & 8) == 0) {
          if ((timeout_ms._4_4_ & 1) != 0) {
            Curl_infof(_data_sock,"Ctrl conn has data while waiting for data conn\n");
            Curl_GetFTPResponse((ssize_t *)&stack0xffffffffffffffa8,(connectdata *)received_local,
                                &local_5c);
            if (3 < local_5c / 100) {
              return CURLE_FTP_ACCEPT_FAILED;
            }
            return CURLE_FTP_WEIRD_SERVER_REPLY;
          }
        }
        else {
          Curl_infof(_data_sock,"Ready to accept data connection from server\n");
          *(undefined1 *)&data->next = 1;
        }
      }
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    Curl_infof(_data_sock,"There is negative response in cache while serv connect\n");
    Curl_GetFTPResponse((ssize_t *)&stack0xffffffffffffffa8,(connectdata *)received_local,&local_5c)
    ;
    conn_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ReceivedServerConnect(struct connectdata *conn, bool *received)
{
  struct SessionHandle *data = conn->data;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int result;
  long timeout_ms;
  ssize_t nread;
  int ftpcode;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect\n");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(pp->cache_size && pp->cache && pp->cache[0] > '3') {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect\n");
    Curl_GetFTPResponse(&nread, conn, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  result = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch (result) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:

    if(result & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server\n");
      *received = TRUE;
    }
    else if(result & CURL_CSELECT_IN) {
      infof(data, "Ctrl conn has data while waiting for data conn\n");
      Curl_GetFTPResponse(&nread, conn, &ftpcode);

      if(ftpcode/100 > 3)
        return CURLE_FTP_ACCEPT_FAILED;

      return CURLE_FTP_WEIRD_SERVER_REPLY;
    }

    break;
  } /* switch() */

  return CURLE_OK;
}